

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O1

void __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
ExtractSubrange(RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *this,int start,int num,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **elements)

{
  int iVar1;
  Arena *pAVar2;
  Rep *pRVar3;
  void **ppvVar4;
  string *psVar5;
  Nonnull<const_char_*> pcVar6;
  ulong uVar7;
  LogMessage local_40;
  
  if (start < 0) {
    pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       ((long)start,0,"start >= 0");
  }
  else {
    pcVar6 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar6 == (Nonnull<const_char_*>)0x0) {
    if (num < 0) {
      pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         ((long)num,0,"num >= 0");
    }
    else {
      pcVar6 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar6 != (Nonnull<const_char_*>)0x0) goto LAB_009635a1;
    iVar1 = (this->super_RepeatedPtrFieldBase).current_size_;
    if (iVar1 < num + start) {
      pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         ((long)(num + start),(long)iVar1,"start + num <= size()");
    }
    else {
      pcVar6 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar6 == (Nonnull<const_char_*>)0x0) {
      if (num == 0) {
        return;
      }
      if (elements == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)0x0) {
        pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                           ((void *)0x0,(void *)0x0,"elements != nullptr");
      }
      else {
        pcVar6 = (Nonnull<const_char_*>)0x0;
      }
      if (pcVar6 == (Nonnull<const_char_*>)0x0) {
        if (elements != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)0x0) {
          pAVar2 = (this->super_RepeatedPtrFieldBase).arena_;
          ppvVar4 = (void **)this;
          if (((ulong)(this->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
            pRVar3 = protobuf::internal::RepeatedPtrFieldBase::rep
                               (&this->super_RepeatedPtrFieldBase);
            ppvVar4 = pRVar3->elements;
          }
          if (pAVar2 == (Arena *)0x0) {
            memcpy(elements,ppvVar4 + start,(long)num << 3);
          }
          else if (0 < num) {
            uVar7 = 0;
            do {
              psVar5 = protobuf::internal::CloneSlow
                                 ((Arena *)0x0,(string *)(ppvVar4 + start)[uVar7]);
              elements[uVar7] = psVar5;
              uVar7 = uVar7 + 1;
            } while ((uint)num != uVar7);
          }
        }
        protobuf::internal::RepeatedPtrFieldBase::CloseGap
                  (&this->super_RepeatedPtrFieldBase,start,num);
        return;
      }
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.h"
                 ,0x59c,pcVar6);
      absl::lts_20250127::log_internal::LogMessage::operator<<
                (&local_40,
                 (char (*) [107])
                 "Releasing elements without transferring ownership is an unsafe operation.  Use UnsafeArenaExtractSubrange."
                );
      goto LAB_009635bb;
    }
  }
  else {
    RepeatedPtrField<std::__cxx11::string>::ExtractSubrange();
LAB_009635a1:
    RepeatedPtrField<std::__cxx11::string>::ExtractSubrange();
  }
  RepeatedPtrField<std::__cxx11::string>::ExtractSubrange();
LAB_009635bb:
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_40);
}

Assistant:

inline void RepeatedPtrField<Element>::ExtractSubrange(int start, int num,
                                                       Element** elements) {
  ABSL_DCHECK_GE(start, 0);
  ABSL_DCHECK_GE(num, 0);
  ABSL_DCHECK_LE(start + num, size());

  if (num == 0) return;

  ABSL_DCHECK_NE(elements, nullptr)
      << "Releasing elements without transferring ownership is an unsafe "
         "operation.  Use UnsafeArenaExtractSubrange.";
  if (elements != nullptr) {
    Arena* arena = GetArena();
    auto* extracted = data() + start;
    if (internal::DebugHardenForceCopyInRelease()) {
      // Always copy.
      for (int i = 0; i < num; ++i) {
        elements[i] = copy<TypeHandler>(extracted[i]);
      }
      if (arena == nullptr) {
        for (int i = 0; i < num; ++i) {
          delete extracted[i];
        }
      }
    } else {
      // If we're on an arena, we perform a copy for each element so that the
      // returned elements are heap-allocated. Otherwise, just forward it.
      if (arena != nullptr) {
        for (int i = 0; i < num; ++i) {
          elements[i] = copy<TypeHandler>(extracted[i]);
        }
      } else {
        memcpy(elements, extracted, num * sizeof(Element*));
      }
    }
  }
  CloseGap(start, num);
}